

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
NoiseModel_InitSuccessWithValidDiamondShape_Test::TestBody
          (NoiseModel_InitSuccessWithValidDiamondShape_Test *this)

{
  aom_noise_model_params_t params_00;
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int *coord;
  int i;
  AssertionResult gtest_ar_1;
  int kCoords [6] [2];
  int kNumCoords;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  aom_noise_model_params_t params;
  aom_noise_model_t model;
  int *in_stack_fffffffffffffb78;
  aom_noise_model_t *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  char *in_stack_fffffffffffffb90;
  aom_noise_model_t *in_stack_fffffffffffffb98;
  int iVar4;
  AssertionResult *this_00;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffba8;
  Type in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  char *in_stack_fffffffffffffbf0;
  AssertionResult *in_stack_fffffffffffffbf8;
  AssertHelper *in_stack_fffffffffffffc00;
  AssertionResult local_3e8;
  double *local_3d8;
  int local_3cc;
  AssertionResult local_3b8;
  double local_3a8 [4];
  double *local_388;
  double *pdStack_380;
  undefined4 local_374;
  undefined4 local_35c;
  AssertionResult local_358;
  string local_348 [64];
  double *local_308;
  undefined8 uStack_300;
  int local_2ec;
  AssertionResult local_2e8;
  double local_2d8;
  double dStack_2d0;
  
  local_2d8 = 4.24399158193054e-314;
  dStack_2d0 = 3.95252516672997e-323;
  local_308 = (double *)0x200000000;
  uStack_300._0_4_ = 8;
  uStack_300._4_4_ = 0;
  params_00.lag = in_stack_fffffffffffffba8;
  params_00._0_4_ = in_stack_fffffffffffffba4;
  params_00.bit_depth = in_stack_fffffffffffffbac;
  params_00.use_highbd = in_stack_fffffffffffffbb0;
  local_2ec = aom_noise_model_init(in_stack_fffffffffffffb98,params_00);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(type *)0x5a0660
            );
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
  if (!(bool)uVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffbe0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               in_stack_fffffffffffffbac,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (int)((ulong)in_stack_fffffffffffffb98 >> 0x20),in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    std::__cxx11::string::~string(local_348);
    testing::Message::~Message((Message *)0x5a0741);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5a07b9);
  local_35c = 6;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             (int *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),
             (int *)in_stack_fffffffffffffb80);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_358);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    testing::AssertionResult::failure_message((AssertionResult *)0x5a085a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               in_stack_fffffffffffffbac,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (int)((ulong)in_stack_fffffffffffffb98 >> 0x20),in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x5a08b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5a090f);
  local_374 = 6;
  local_388 = (double *)0xfffffffe;
  pdStack_380 = (double *)0xffffffff;
  local_3a8[2] = -NAN;
  local_3a8[3] = -NAN;
  local_3a8[0] = -NAN;
  local_3a8[1] = -NAN;
  this_01 = &local_3b8;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             (int *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),
             (int *)in_stack_fffffffffffffb80);
  iVar4 = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x5a09dd);
    in_stack_fffffffffffffbac = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,in_stack_fffffffffffffbac,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),iVar4,
               in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x5a0a3a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5a0a92);
  for (local_3cc = 0; local_3cc < 6; local_3cc = local_3cc + 1) {
    local_3d8 = local_3a8 + local_3cc;
    this_00 = &local_3e8;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (&this_00->success_,in_stack_fffffffffffffb90,
               (int *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),
               (int *)in_stack_fffffffffffffb80);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
    in_stack_fffffffffffffba4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffba4);
    if (!bVar2) {
      testing::Message::Message((Message *)this_01);
      in_stack_fffffffffffffb90 =
           testing::AssertionResult::failure_message((AssertionResult *)0x5a0b65);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,in_stack_fffffffffffffbac,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 (int)((ulong)this_00 >> 0x20),in_stack_fffffffffffffb90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
      testing::Message::~Message((Message *)0x5a0bc2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5a0c17);
    in_stack_fffffffffffffb80 = (aom_noise_model_t *)&stack0xfffffffffffffbf8;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (&this_00->success_,in_stack_fffffffffffffb90,
               (int *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),
               (int *)in_stack_fffffffffffffb80);
    iVar4 = (int)((ulong)this_00 >> 0x20);
    in_stack_fffffffffffffb8f =
         testing::AssertionResult::operator_cast_to_bool
                   ((AssertionResult *)in_stack_fffffffffffffb80);
    if (!(bool)in_stack_fffffffffffffb8f) {
      testing::Message::Message((Message *)this_01);
      testing::AssertionResult::failure_message((AssertionResult *)0x5a0cbb);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,in_stack_fffffffffffffbac,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),iVar4,
                 in_stack_fffffffffffffb90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
      testing::Message::~Message((Message *)0x5a0d07);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5a0d56);
  }
  aom_noise_model_free(in_stack_fffffffffffffb80);
  return;
}

Assistant:

TEST(NoiseModel, InitSuccessWithValidDiamondShape) {
  aom_noise_model_t model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_DIAMOND, 2, 8, 0 };
  EXPECT_TRUE(aom_noise_model_init(&model, params));
  EXPECT_EQ(6, model.n);
  const int kNumCoords = 6;
  const int kCoords[][2] = { { 0, -2 }, { -1, -1 }, { 0, -1 },
                             { 1, -1 }, { -2, 0 },  { -1, 0 } };
  EXPECT_EQ(kNumCoords, model.n);
  for (int i = 0; i < kNumCoords; ++i) {
    const int *coord = kCoords[i];
    EXPECT_EQ(coord[0], model.coords[i][0]);
    EXPECT_EQ(coord[1], model.coords[i][1]);
  }
  aom_noise_model_free(&model);
}